

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall
gl4cts::anon_unknown_0::AdvancedUnsizedArrayLength2::Run(AdvancedUnsizedArrayLength2 *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  bool bVar2;
  GLuint GVar3;
  uint uVar4;
  long lVar5;
  undefined4 *puVar6;
  void *pvVar7;
  int stagept;
  int stagept_00;
  int iVar8;
  byte bVar9;
  GLintptr offset;
  int i;
  long lVar10;
  ulong uVar11;
  int iVar12;
  GLuint local_fc;
  allocator_type local_e9;
  int sizes [8];
  GLint minA;
  GLuint *local_b0;
  int bufsize [8] [2];
  GLint blocksC;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> data;
  Vector<int,_4> local_40;
  
  (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[9]
  )();
  if ((this->stage == 0) &&
     (bVar2 = ShaderStorageBufferObjectBase::SupportedInVS
                        (&this->super_ShaderStorageBufferObjectBase,8), !bVar2)) {
    return 0x10;
  }
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90db,&blocksC);
  glu::CallLogWrapper::glGetIntegerv(this_00,0x90df,&minA);
  if (blocksC < 8) {
    return 0x10;
  }
  if (this->stage == 1) {
    gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShaderPT_abi_cxx11_
              ((string *)bufsize,(void *)0x0,stagept);
    gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShader_abi_cxx11_
              ((string *)sizes,this);
    GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,(string *)bufsize,(string *)sizes)
    ;
LAB_00a11905:
    this->m_program = GVar3;
    std::__cxx11::string::~string((string *)sizes);
  }
  else {
    if (this->stage == 0) {
      gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShader_abi_cxx11_
                ((string *)bufsize,this);
      gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShaderPT_abi_cxx11_
                ((string *)sizes,&DAT_00000001,stagept_00);
      GVar3 = ShaderStorageBufferObjectBase::CreateProgram
                        (&this->super_ShaderStorageBufferObjectBase,(string *)bufsize,
                         (string *)sizes);
      goto LAB_00a11905;
    }
    gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShader_abi_cxx11_
              ((string *)bufsize,this);
    GVar3 = ShaderStorageBufferObjectBase::CreateProgramCS
                      (&this->super_ShaderStorageBufferObjectBase,(string *)bufsize);
    this->m_program = GVar3;
  }
  std::__cxx11::string::~string((string *)bufsize);
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  if (!bVar2) {
    return -1;
  }
  glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
  local_b0 = this->m_storage_buffer;
  glu::CallLogWrapper::glGenBuffers(this_00,8,local_b0);
  sizes[4] = 0x17;
  sizes[5] = 0x7b;
  sizes[6] = 0x1a3;
  sizes[7] = 8;
  sizes[0] = 7;
  sizes[1] = 5;
  sizes[2] = 3;
  sizes[3] = 4;
  bufsize[6][0] = 0;
  bufsize[6][1] = 0;
  bufsize[7][0] = 0;
  bufsize[7][1] = 0;
  bufsize[4][0] = 0;
  bufsize[4][1] = 0;
  bufsize[5][0] = 0;
  bufsize[5][1] = 0;
  bufsize[2][0] = 0;
  bufsize[2][1] = 0;
  bufsize[3][0] = 0;
  bufsize[3][1] = 0;
  bufsize[0][0] = 0;
  bufsize[0][1] = 0;
  bufsize[1][0] = 0;
  bufsize[1][1] = 0;
  tcu::Vector<int,_4>::Vector(&local_40,0x29);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&data,100000,&local_40,&local_e9);
  local_fc = 0;
  for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 4) {
    iVar1 = this->etype;
    lVar5 = (long)iVar1;
    if (this->layout == 0) {
      iVar12 = *(int *)(&DAT_0169fb00 + lVar5 * 0x20 + lVar10) << 4;
      *(int *)((long)bufsize[0] + lVar10 * 2 + 4) = iVar12;
      if (iVar1 == 3) {
        puVar6 = (undefined4 *)&DAT_016aefb0;
LAB_00a11a77:
        iVar12 = *(int *)(lVar10 + (long)puVar6);
        goto LAB_00a11a90;
      }
    }
    else if (this->layout == 1) {
      lVar5 = lVar5 * 0x20 + lVar10;
      iVar12 = *(int *)(&DAT_0169fb00 + lVar5) * *(int *)(&DAT_0169fb80 + lVar5) * 4;
      *(int *)((long)bufsize[0] + lVar10 * 2 + 4) = iVar12;
      if (iVar1 == 3) {
        puVar6 = &DAT_016aef90;
        goto LAB_00a11a77;
      }
    }
    else {
      iVar12 = *(int *)(&DAT_0169fc00 + lVar5 * 0x20 + lVar10);
LAB_00a11a90:
      iVar12 = iVar12 << 2;
      *(int *)((long)bufsize[0] + lVar10 * 2 + 4) = iVar12;
    }
    iVar1 = *(int *)((long)sizes + lVar10);
    iVar8 = iVar12 * iVar1;
    *(int *)((long)bufsize[0] + lVar10 * 2) = iVar8;
    GVar3 = *(GLuint *)((long)this->m_storage_buffer + lVar10);
    if ((lVar10 == 0x1c) || (this->bind_seq == 0)) {
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,local_fc,GVar3);
      glu::CallLogWrapper::glBufferData
                (this_00,0x90d2,(long)iVar8,
                 data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0x88ea);
    }
    else {
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,GVar3);
      glu::CallLogWrapper::glBufferData
                (this_00,0x90d2,(long)iVar8,
                 data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0x88ea);
      if (this->bind_seq == 2) {
        if (iVar12 * 2 < minA) goto LAB_00a11b60;
        offset = (GLintptr)(iVar12 * 2);
        iVar12 = iVar8 + iVar12 * -2;
      }
      else {
        if (this->bind_seq == 1) {
          glu::CallLogWrapper::glBindBufferBase
                    (this_00,0x90d2,local_fc,*(GLuint *)((long)local_b0 + lVar10));
          goto LAB_00a11b94;
        }
LAB_00a11b60:
        iVar12 = (iVar1 + -2) * iVar12;
        offset = 0;
      }
      glu::CallLogWrapper::glBindBufferRange
                (this_00,0x90d2,local_fc,*(GLuint *)((long)local_b0 + lVar10),offset,(long)iVar12);
    }
LAB_00a11b94:
    local_fc = local_fc + 1;
  }
  if (this->stage == 2) {
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
  }
  else {
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
  }
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[7]);
  pvVar7 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x20,1);
  lVar10 = -1;
  if (pvVar7 == (void *)0x0) goto LAB_00a11df7;
  bVar9 = 1;
  for (uVar11 = 0; uVar11 != 7; uVar11 = uVar11 + 1) {
    if (this->other_members == true) {
      sizes[uVar11] = sizes[uVar11] + -1;
    }
    if ((this->bind_seq & 0xfffffffeU) == 2) {
      sizes[uVar11] = sizes[uVar11] + -2;
    }
    uVar4 = this->layout;
    if ((uVar4 < 2) && (*(int *)((long)pvVar7 + uVar11 * 4) != sizes[uVar11])) {
      anon_unknown_0::Output("Array %d length is %d should be %d.\n",uVar11 & 0xffffffff);
      uVar4 = this->layout;
      bVar9 = 0;
    }
    if (((uVar4 & 0xfffffffe) == 2) && (sizes[uVar11] < *(int *)((long)pvVar7 + uVar11 * 4))) {
      bVar9 = 0;
      anon_unknown_0::Output
                ("Array %d length is %d should be not greater that %d.\n",uVar11 & 0xffffffff);
    }
  }
  glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  if (this->length_as_index == true) {
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[4]);
    pvVar7 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,(long)bufsize[4][0],1);
    if (pvVar7 == (void *)0x0) goto LAB_00a11df7;
    lVar5 = (long)this->etype * 0x20;
    if (*(int *)((long)pvVar7 +
                (long)((sizes[4] + -2) * *(int *)(&DAT_0169fb10 + lVar5) *
                      *(int *)(&DAT_0169fb90 + lVar5)) * 4) != 0x52) {
      bVar9 = 0;
      anon_unknown_0::Output("Array 4 index %d is %d should be 82.\n");
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[6]);
    pvVar7 = glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,(long)bufsize[6][0],1);
    if (pvVar7 == (void *)0x0) goto LAB_00a11df7;
    lVar10 = (long)this->etype * 0x20;
    if (*(int *)((long)pvVar7 +
                (long)((sizes[6] + -2) * *(int *)(&DAT_0169fb18 + lVar10) *
                      *(int *)(&DAT_0169fb98 + lVar10)) * 4) != 0x52) {
      bVar9 = 0;
      anon_unknown_0::Output("Array 6 index %d is %d should be 82.\n");
    }
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
  }
  lVar10 = -(ulong)(~bVar9 & 1);
LAB_00a11df7:
  std::_Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~_Vector_base
            (&data.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>);
  return lVar10;
}

Assistant:

virtual long Run()
	{
		const int kSize = 100000;
		const int kBufs = 8;
		SetPath();
		if (stage == vertex && !SupportedInVS(8))
			return NOT_SUPPORTED;
		GLint blocksC;
		glGetIntegerv(GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS, &blocksC);
		GLint minA;
		glGetIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &minA);
		if (blocksC < kBufs)
			return NOT_SUPPORTED;
		if (stage == vertex)
		{
			std::string glsl_vs = BuildShader();
			std::string glsl_fs = BuildShaderPT(fragment);
			m_program			= CreateProgram(glsl_vs, glsl_fs);
		}
		else if (stage == fragment)
		{
			std::string glsl_vs = BuildShaderPT(vertex);
			std::string glsl_fs = BuildShader();
			m_program			= CreateProgram(glsl_vs, glsl_fs);
		}
		else
		{ // compute
			std::string glsl_cs = BuildShader();
			m_program			= CreateProgramCS(glsl_cs);
		}
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;
		glUseProgram(m_program);

		glGenBuffers(kBufs, m_storage_buffer);
		int sizes[kBufs] = { 7, 5, 3, 4, 23, 123, 419, 8 };

		int columns[4][kBufs] = { { 1, 1, 1, 1, 1, 1, 1, 1 },   // vector: 1 col
								  { 2, 3, 4, 4, 2, 3, 4, 1 },   // mat: # of cols
								  { 2, 3, 4, 4, 3, 2, 2, 1 },   // RM mat: # of rows
								  { 1, 1, 1, 1, 1, 1, 1, 1 } }; // structure: not used

		int scalars[4][kBufs] = { { 4, 4, 4, 4, 2, 2, 4, 1 },   //vector: size
								  { 2, 4, 4, 4, 4, 2, 2, 1 },   //matrix column_major: rows
								  { 2, 4, 4, 4, 2, 4, 4, 1 },   //matrix row_major: columns
								  { 1, 1, 1, 1, 1, 1, 1, 1 } }; //structure: not used

		int mindw[4][kBufs] = { { 3, 4, 3, 3, 2, 2, 4, 1 }, // # of real 32bit items
								{ 4, 9, 16, 16, 6, 6, 8, 1 },
								{ 4, 9, 16, 16, 6, 6, 8, 1 },
								{ 4, 11, 35, 35, 81, 127, 381, 1 } };
		int std430struct[kBufs] = { 4, 16, 48, 48, 88, 68, 264, 1 };
		int std140struct[kBufs] = { 4, 16, 60, 60, 144, 80, 432, 1 };
		int bufsize[kBufs][2]   = { { 0 } };

		std::vector<ivec4> data(kSize, ivec4(41));
		for (int i = 0; i < kBufs; ++i)
		{
			if (layout == std430)
			{
				bufsize[i][1] = 4 * columns[etype][i] * scalars[etype][i];
				if (etype == structure)
				{
					bufsize[i][1] = 4 * std430struct[i];
				}
			}
			else if (layout == std140)
			{
				bufsize[i][1] = 4 * columns[etype][i] * 4;
				if (etype == structure)
				{
					bufsize[i][1] = 4 * std140struct[i];
				}
			}
			else
			{
				bufsize[i][1] = 4 * mindw[etype][i];
			}
			bufsize[i][0] = sizes[i] * bufsize[i][1];
			if (i == kBufs - 1 || bind_seq == bindbasebefore)
			{ // never trim feedback storage
				glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
				glBufferData(GL_SHADER_STORAGE_BUFFER, bufsize[i][0], &data[0], GL_DYNAMIC_COPY);
			}
			else
			{
				glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[i]);
				glBufferData(GL_SHADER_STORAGE_BUFFER, bufsize[i][0], &data[0], GL_DYNAMIC_COPY);
				if (bind_seq == bindbaseafter)
				{
					glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
				}
				else if (bind_seq == bindrangeoffset && 2 * bufsize[i][1] >= minA)
				{
					glBindBufferRange(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i], 2 * bufsize[i][1],
									  bufsize[i][0] - 2 * bufsize[i][1]); // without 2 elements
				}
				else
				{ // bind_seq == bindrangesize || 2*bufsize[i][1] < minA
					glBindBufferRange(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i], 0,
									  bufsize[i][0] - 2 * bufsize[i][1]); // without 2 elements
				}
			}
		}

		if (stage != compute)
		{
			glGenVertexArrays(1, &m_vertex_array);
			glBindVertexArray(m_vertex_array);
			glDrawArrays(GL_POINTS, 0, 1);
		}
		else
		{
			glDispatchCompute(1, 1, 1);
		}
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[kBufs - 1]);
		int* dataout = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * sizes[kBufs - 1], GL_MAP_READ_BIT);
		if (!dataout)
			return ERROR;
		bool status = true;
		for (int i = 0; i < kBufs - 1; ++i)
		{
			if (other_members)
				sizes[i] -= 1; // space consumed by a pad
			if (bind_seq == bindrangesize || bind_seq == bindrangeoffset)
				sizes[i] -= 2; // space constrained by offset of range size
			if ((layout == std140 || layout == std430) && dataout[i] != sizes[i])
			{
				Output("Array %d length is %d should be %d.\n", i, dataout[i], sizes[i]);
				status = false;
			}
			if ((layout == packed || layout == shared) && (dataout[i] > sizes[i]))
			{
				Output("Array %d length is %d should be not greater that %d.\n", i, dataout[i], sizes[i]);
				status = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		if (length_as_index)
		{
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[4]);
			dataout = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, bufsize[4][0], GL_MAP_READ_BIT);
			if (!dataout)
				return ERROR;
			int i = (sizes[4] - 2) * columns[etype][4] * scalars[etype][4];
			if (dataout[i] != 82)
			{
				Output("Array 4 index %d is %d should be 82.\n", i, dataout[i]);
				status = false;
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[6]);
			dataout = (int*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, bufsize[6][0], GL_MAP_READ_BIT);
			if (!dataout)
				return ERROR;
			i = (sizes[6] - 2) * columns[etype][6] * scalars[etype][6];
			if (dataout[i] != 82)
			{
				Output("Array 6 index %d is %d should be 82.\n", i, dataout[i]);
				status = false;
			}
			glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		}

		if (!status)
			return ERROR;

		return NO_ERROR;
	}